

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiListClipperRange * __thiscall
ImVector<ImGuiListClipperRange>::insert
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *it,ImGuiListClipperRange *v)

{
  int *piVar1;
  ImGuiListClipperRange *pIVar2;
  int iVar3;
  ImGuiListClipperRange *__dest;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  __dest = this->Data;
  lVar6 = (long)it - (long)__dest;
  iVar3 = this->Size;
  if (iVar3 == this->Capacity) {
    if (iVar3 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar3 / 2 + iVar3;
    }
    iVar7 = iVar3 + 1;
    if (iVar3 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiListClipperRange *)
             (*GImAllocatorAllocFunc)((long)iVar7 * 0xc,GImAllocatorUserData);
    if (this->Data != (ImGuiListClipperRange *)0x0) {
      memcpy(__dest,this->Data,(long)this->Size * 0xc);
      pIVar2 = this->Data;
      if ((pIVar2 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    this->Data = __dest;
    this->Capacity = iVar7;
    iVar3 = this->Size;
  }
  lVar4 = (long)iVar3 + (lVar6 >> 2) * 0x5555555555555555;
  if (lVar4 != 0 && (lVar6 >> 2) * -0x5555555555555555 <= (long)iVar3) {
    memmove((void *)((long)__dest + lVar6 + 0xc),(void *)((long)__dest + lVar6),lVar4 * 0xc);
    __dest = this->Data;
  }
  *(undefined4 *)((long)__dest + lVar6 + 8) = *(undefined4 *)&v->PosToIndexConvert;
  *(undefined8 *)((long)__dest + lVar6) = *(undefined8 *)v;
  this->Size = this->Size + 1;
  return (ImGuiListClipperRange *)(lVar6 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }